

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter>
Catch::addReporter(Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  type tVar1;
  IStreamingReporter *pIVar2;
  Ptr<Catch::IStreamingReporter> *in_RSI;
  Ptr<Catch::IStreamingReporter> *in_RDI;
  MultipleReporters *multi;
  Ptr<Catch::IStreamingReporter> *resultingReporter;
  Ptr<Catch::IStreamingReporter> *in_stack_ffffffffffffff88;
  MultipleReporters *in_stack_ffffffffffffff90;
  long local_68;
  Ptr<Catch::IStreamingReporter> *this;
  
  this = in_RDI;
  Ptr<Catch::IStreamingReporter>::Ptr(in_RDI);
  tVar1 = Ptr::operator_cast_to_function_pointer((Ptr<Catch::IStreamingReporter> *)0x1a3184);
  if (tVar1 == 0) {
    Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
  }
  else {
    pIVar2 = Ptr<Catch::IStreamingReporter>::get(in_RSI);
    if (pIVar2 == (IStreamingReporter *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(pIVar2,&IStreamingReporter::typeinfo,&MultipleReporters::typeinfo,0)
      ;
    }
    if (local_68 == 0) {
      in_stack_ffffffffffffff90 = (MultipleReporters *)operator_new(0x28);
      MultipleReporters::MultipleReporters(in_stack_ffffffffffffff90);
      Ptr<Catch::IStreamingReporter>::Ptr
                ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff90,
                 (IStreamingReporter *)in_stack_ffffffffffffff88);
      Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
      Ptr<Catch::IStreamingReporter>::~Ptr
                ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff88 =
           (Ptr<Catch::IStreamingReporter> *)
           Ptr::operator_cast_to_function_pointer((Ptr<Catch::IStreamingReporter> *)0x1a3268);
      if (in_stack_ffffffffffffff88 != (Ptr<Catch::IStreamingReporter> *)0x0) {
        MultipleReporters::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
    }
    MultipleReporters::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = dynamic_cast<MultipleReporters*>( existingReporter.get() );
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}